

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

void secp256k1_context_destroy(secp256k1_context *ctx)

{
  if (ctx != (secp256k1_context *)0x0) {
    if (secp256k1_context_no_precomp == ctx) {
      secp256k1_context_destroy_cold_1();
    }
    free(ctx);
    return;
  }
  return;
}

Assistant:

void secp256k1_context_destroy(secp256k1_context* ctx) {
    if (ctx != NULL) {
        secp256k1_context_preallocated_destroy(ctx);
        free(ctx);
    }
}